

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::Run(cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool noconfigure)

{
  bool bVar1;
  WorkingMode WVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  allocator local_81;
  string local_80 [8];
  string message;
  int ret;
  allocator local_49;
  string local_48;
  byte local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool noconfigure_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  local_21 = noconfigure;
  pvStack_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  SetArgs(this,args,false);
  bVar1 = cmSystemTools::GetErrorOccuredFlag();
  if (bVar1) {
    this_local._4_4_ = -1;
  }
  else {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmakeCheckStampList(pcVar5,true);
      if (bVar1) {
        return 0;
      }
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmakeCheckStampFile(pcVar5,true);
      if (bVar1) {
        return 0;
      }
    }
    WVar2 = GetWorkingMode(this);
    if (WVar2 == NORMAL_MODE) {
      iVar3 = LoadCache(this);
      if (iVar3 < 0) {
        cmSystemTools::Error
                  ("Error executing cmake::LoadCache(). Aborting.\n",(char *)0x0,(char *)0x0,
                   (char *)0x0);
        return -1;
      }
    }
    else {
      AddCMakePaths(this);
    }
    bVar1 = SetCacheArgs(this,pvStack_20);
    if (bVar1) {
      WVar2 = GetWorkingMode(this);
      if (WVar2 == NORMAL_MODE) {
        bVar1 = cmsys::SystemTools::HasEnv("MAKEFLAGS");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_48,"MAKEFLAGS=",&local_49);
          cmsys::SystemTools::PutEnv(&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          std::allocator<char>::~allocator((allocator<char> *)&local_49);
        }
        PreLoadCMakeFiles(this);
        if ((local_21 & 1) == 0) {
          iVar3 = CheckBuildSystem(this);
          if (iVar3 == 0) {
            this_local._4_4_ = 0;
          }
          else {
            message.field_2._8_4_ = Configure(this);
            if ((message.field_2._8_4_ == 0) && (WVar2 = GetWorkingMode(this), WVar2 == NORMAL_MODE)
               ) {
              message.field_2._8_4_ = Generate(this);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_80,"Build files have been written to: ",&local_81);
              std::allocator<char>::~allocator((allocator<char> *)&local_81);
              pcVar5 = GetHomeOutputDirectory(this);
              std::__cxx11::string::operator+=(local_80,pcVar5);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              UpdateProgress(this,pcVar5,-1.0);
              this_local._4_4_ = message.field_2._8_4_;
              std::__cxx11::string::~string(local_80);
            }
            else {
              this_local._4_4_ = message.field_2._8_4_;
            }
          }
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      else {
        bVar1 = cmSystemTools::GetErrorOccuredFlag();
        if (bVar1) {
          this_local._4_4_ = -1;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
    }
    else {
      cmSystemTools::Error
                ("Problem processing arguments. Aborting.\n",(char *)0x0,(char *)0x0,(char *)0x0);
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmake::Run(const std::vector<std::string>& args, bool noconfigure)
{
  // Process the arguments
  this->SetArgs(args);
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }

  // If we are given a stamp list file check if it is really out of date.
  if (!this->CheckStampList.empty() &&
      cmakeCheckStampList(this->CheckStampList.c_str())) {
    return 0;
  }

  // If we are given a stamp file check if it is really out of date.
  if (!this->CheckStampFile.empty() &&
      cmakeCheckStampFile(this->CheckStampFile.c_str())) {
    return 0;
  }

  if (this->GetWorkingMode() == NORMAL_MODE) {
    // load the cache
    if (this->LoadCache() < 0) {
      cmSystemTools::Error("Error executing cmake::LoadCache(). Aborting.\n");
      return -1;
    }
  } else {
    this->AddCMakePaths();
  }

  // Add any cache args
  if (!this->SetCacheArgs(args)) {
    cmSystemTools::Error("Problem processing arguments. Aborting.\n");
    return -1;
  }

  // In script mode we terminate after running the script.
  if (this->GetWorkingMode() != NORMAL_MODE) {
    if (cmSystemTools::GetErrorOccuredFlag()) {
      return -1;
    }
    return 0;
  }

  // If MAKEFLAGS are given in the environment, remove the environment
  // variable.  This will prevent try-compile from succeeding when it
  // should fail (if "-i" is an option).  We cannot simply test
  // whether "-i" is given and remove it because some make programs
  // encode the MAKEFLAGS variable in a strange way.
  if (cmSystemTools::HasEnv("MAKEFLAGS")) {
    cmSystemTools::PutEnv("MAKEFLAGS=");
  }

  this->PreLoadCMakeFiles();

  if (noconfigure) {
    return 0;
  }

  // now run the global generate
  // Check the state of the build system to see if we need to regenerate.
  if (!this->CheckBuildSystem()) {
    return 0;
  }

  int ret = this->Configure();
  if (ret || this->GetWorkingMode() != NORMAL_MODE) {
#if defined(CMAKE_HAVE_VS_GENERATORS)
    if (!this->VSSolutionFile.empty() && this->GlobalGenerator) {
      // CMake is running to regenerate a Visual Studio build tree
      // during a build from the VS IDE.  The build files cannot be
      // regenerated, so we should stop the build.
      cmSystemTools::Message("CMake Configure step failed.  "
                             "Build files cannot be regenerated correctly.  "
                             "Attempting to stop IDE build.");
      cmGlobalVisualStudioGenerator* gg =
        static_cast<cmGlobalVisualStudioGenerator*>(this->GlobalGenerator);
      gg->CallVisualStudioMacro(cmGlobalVisualStudioGenerator::MacroStop,
                                this->VSSolutionFile.c_str());
    }
#endif
    return ret;
  }
  ret = this->Generate();
  std::string message = "Build files have been written to: ";
  message += this->GetHomeOutputDirectory();
  this->UpdateProgress(message.c_str(), -1);
  return ret;
}